

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX.h
# Opt level: O1

void __thiscall Bitmap_Item::~Bitmap_Item(Bitmap_Item *this)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  
  if (this->display != (Display *)0x0) {
    if (this->bitmap != 0) {
      XFreePixmap();
    }
    if (this->mask != 0) {
      XFreePixmap(this->display);
    }
    if (this->inverted_mask != 0) {
      XFreePixmap(this->display);
    }
  }
  if (this->colors != (XColor *)0x0) {
    uVar1 = XDefaultColormap(this->display,*(undefined4 *)(this->display + 0xe0));
    if (0 < this->num_colors) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        XFreeColors(this->display,uVar1,(long)&this->colors->pixel + lVar3,1,0);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < this->num_colors);
    }
    if (this->colors != (XColor *)0x0) {
      operator_delete__(this->colors);
    }
    this->colors = (XColor *)0x0;
  }
  return;
}

Assistant:

~Bitmap_Item()
  {
    if (display) {
      if (bitmap)
        XFreePixmap(display, bitmap);
      if (mask)
        XFreePixmap(display, mask);
      if (inverted_mask)
        XFreePixmap(display, inverted_mask);
    }
    if (colors) {
      int screen_num = DefaultScreen(display);
      Colormap c = XDefaultColormap(display, screen_num);
      for (int i = 0; i < num_colors; i++)
        XFreeColors(display, c, &(colors[i].pixel), 1, 0);
      delete[] colors;
      colors = nullptr;
    }
  }